

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::InsertDebugUtilsLabel
          (VulkanCommandBuffer *this,VkDebugUtilsLabelEXT *Label)

{
  Char *pCVar1;
  char (*in_RCX) [55];
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  VkDebugUtilsLabelEXT *Label_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = Label;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [55])0x306;
    Diligent::DebugAssertionFailed
              (pCVar1,"InsertDebugUtilsLabel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x306);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (*(int *)msg.field_2._8_8_ != 0x3b9cbe02) {
    Diligent::FormatString<char[26],char[55]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Label.sType == VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT",in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"InsertDebugUtilsLabel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x307);
    std::__cxx11::string::~string((string *)local_68);
  }
  if (vkCmdInsertDebugUtilsLabelEXT != (PFN_vkCmdInsertDebugUtilsLabelEXT)0x0) {
    (*vkCmdInsertDebugUtilsLabelEXT)(this->m_VkCmdBuffer,(VkDebugUtilsLabelEXT *)msg.field_2._8_8_);
  }
  return;
}

Assistant:

__forceinline void InsertDebugUtilsLabel(const VkDebugUtilsLabelEXT& Label)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY_EXPR(Label.sType == VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT);

        // Pointer to the function may be null if validation layer is not enabled
        if (vkCmdInsertDebugUtilsLabelEXT != nullptr)
            vkCmdInsertDebugUtilsLabelEXT(m_VkCmdBuffer, &Label);
#else
        LOG_WARNING_MESSAGE_ONCE("Debug utils are not supported when vulkan library is linked statically");
#endif
    }